

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar11;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar12;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar13;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar14;
  double dVar15;
  double dVar16;
  value_type vVar17;
  double dVar18;
  
  pFVar8 = (this->left_->fadexpr_).expr_;
  pFVar9 = (pFVar8->fadexpr_).expr_.fadexpr_.left_;
  pFVar10 = (pFVar9->fadexpr_).right_;
  dVar1 = (pFVar9->fadexpr_).left_.constant_;
  dVar2 = (pFVar8->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar3 = (pFVar10->dx_).ptr_to_data[i];
  dVar15 = sin((pFVar10->val_ * dVar1) / dVar2);
  pFVar11 = this->right_;
  pFVar12 = (pFVar11->fadexpr_).left_;
  dVar4 = (pFVar12->fadexpr_).left_.constant_;
  pFVar13 = (pFVar12->fadexpr_).right_;
  dVar16 = sin((pFVar13->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar13->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar14 = (pFVar11->fadexpr_).right_;
  pFVar9 = (pFVar14->fadexpr_).left_;
  dVar5 = (pFVar9->fadexpr_).left_.constant_;
  dVar6 = ((pFVar9->fadexpr_).right_)->val_;
  dVar7 = (pFVar14->fadexpr_).right_.constant_;
  vVar17 = FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
           ::fastAccessDx(&this->right_->fadexpr_,i);
  pFVar8 = (this->left_->fadexpr_).expr_;
  pFVar9 = (pFVar8->fadexpr_).expr_.fadexpr_.left_;
  dVar18 = cos(((pFVar9->fadexpr_).left_.constant_ * ((pFVar9->fadexpr_).right_)->val_) /
               (pFVar8->fadexpr_).expr_.fadexpr_.right_.constant_);
  return (dVar16 * dVar4 + (dVar5 * dVar6) / dVar7) * dVar15 * ((dVar1 * dVar3) / dVar2) -
         dVar18 * vVar17;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}